

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int tf_get_next_job(AV1TemporalFilterSync *tf_mt_sync,int *current_mb_row,int mb_rows)

{
  pthread_mutex_t *__mutex;
  int in_EDX;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  pthread_mutex_t *tf_mutex_;
  int do_next_row;
  int local_18;
  
  local_18 = 0;
  __mutex = (pthread_mutex_t *)*in_RDI;
  pthread_mutex_lock(__mutex);
  if (((*(byte *)((long)in_RDI + 0xc) & 1) == 0) && (*(int *)(in_RDI + 1) < in_EDX)) {
    *in_RSI = *(undefined4 *)(in_RDI + 1);
    *(int *)(in_RDI + 1) = *(int *)(in_RDI + 1) + 1;
    local_18 = 1;
  }
  pthread_mutex_unlock(__mutex);
  return local_18;
}

Assistant:

static inline int tf_get_next_job(AV1TemporalFilterSync *tf_mt_sync,
                                  int *current_mb_row, int mb_rows) {
  int do_next_row = 0;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *tf_mutex_ = tf_mt_sync->mutex_;
  pthread_mutex_lock(tf_mutex_);
#endif
  if (!tf_mt_sync->tf_mt_exit && tf_mt_sync->next_tf_row < mb_rows) {
    *current_mb_row = tf_mt_sync->next_tf_row;
    tf_mt_sync->next_tf_row++;
    do_next_row = 1;
  }
#if CONFIG_MULTITHREAD
  pthread_mutex_unlock(tf_mutex_);
#endif
  return do_next_row;
}